

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
::load(map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
       *this,handle src,bool convert)

{
  bool bVar1;
  PyObject **ppPVar2;
  template_cast_op_type<typename_std::add_rvalue_reference<basic_string<char>_&&>::type> __args;
  template_cast_op_type<typename_std::add_rvalue_reference<unsigned_int_&&>::type> __args_1;
  reference rVar3;
  handle local_e0;
  handle local_d8;
  type_caster<unsigned_int,_void> local_cc;
  undefined1 local_c8 [4];
  value_conv vconv;
  key_conv kconv;
  value_type it;
  dict_iterator __end3;
  undefined1 local_68 [8];
  dict_iterator __begin3;
  dict *__range3;
  dict local_38;
  dict d;
  bool convert_local;
  map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *this_local;
  handle src_local;
  
  d.super_object.super_handle.m_ptr = (object)(object)src.m_ptr;
  bVar1 = isinstance<pybind11::dict,_0>(src);
  if (bVar1) {
    reinterpret_borrow<pybind11::dict>((pybind11 *)&local_38,src);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::clear(&this->value);
    __begin3.super_dict_readonly.pos = (ssize_t)&local_38;
    dict::begin((dict_iterator *)local_68,&local_38);
    dict::end((dict_iterator *)&it.second,(dict *)__begin3.super_dict_readonly.pos);
    while (bVar1 = detail::operator!=((It *)local_68,(It *)&it.second), bVar1) {
      rVar3 = generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator*
                        ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)
                         local_68);
      it.first = rVar3.second.m_ptr;
      kconv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value.field_2._8_8_ = rVar3.first.m_ptr;
      type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                     *)local_c8);
      ppPVar2 = pybind11::handle::ptr
                          ((handle *)
                           ((long)&kconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value.field_2 + 8));
      pybind11::handle::handle(&local_d8,*ppPVar2);
      bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)local_c8,local_d8,convert);
      if (bVar1) {
        ppPVar2 = pybind11::handle::ptr(&it.first);
        pybind11::handle::handle(&local_e0,*ppPVar2);
        bVar1 = type_caster<unsigned_int,_void>::load(&local_cc,local_e0,convert);
        if (!bVar1) goto LAB_007d8483;
        __args = cast_op<std::__cxx11::string&&>
                           ((make_caster<std::__cxx11::basic_string<char>_&&> *)local_c8);
        __args_1 = cast_op<unsigned_int&&>(&local_cc);
        std::
        map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
        ::emplace<std::__cxx11::string,unsigned_int>
                  ((map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                    *)this,__args,__args_1);
        bVar1 = false;
      }
      else {
LAB_007d8483:
        src_local.m_ptr._7_1_ = 0;
        bVar1 = true;
      }
      type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::~type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      *)local_c8);
      if (bVar1) goto LAB_007d8581;
      generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)local_68);
    }
    src_local.m_ptr._7_1_ = 1;
LAB_007d8581:
    dict::~dict(&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }